

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::TextureMagFilterCase::testTexture
          (TextureMagFilterCase *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  TexParamVerifier *pTVar2;
  long lVar3;
  
  pTVar2 = (this->super_TextureCase).m_verifier;
  (*pTVar2->_vptr_TexParamVerifier[2])
            (pTVar2,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,0x2800
             ,0x2601);
  ApiCase::expectError((ApiCase *)this,0);
  this_00 = &(this->super_TextureCase).super_ApiCase.super_CallLogWrapper;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    uVar1 = *(uint *)((long)&s_testMagFilters + lVar3);
    glu::CallLogWrapper::glTexParameteri
              (this_00,(this->super_TextureCase).m_textureTarget,0x2800,uVar1);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar2 = (this->super_TextureCase).m_verifier;
    (*pTVar2->_vptr_TexParamVerifier[2])
              (pTVar2,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               0x2800,(ulong)uVar1);
    ApiCase::expectError((ApiCase *)this,0);
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    uVar1 = *(uint *)((long)&s_testMagFilters + lVar3);
    glu::CallLogWrapper::glTexParameterf
              (this_00,(this->super_TextureCase).m_textureTarget,0x2800,(float)uVar1);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar2 = (this->super_TextureCase).m_verifier;
    (*pTVar2->_vptr_TexParamVerifier[2])
              (pTVar2,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               0x2800,(ulong)uVar1);
    ApiCase::expectError((ApiCase *)this,0);
  }
  return;
}

Assistant:

void testTexture (void)
	{
		const GLenum magValues[] = {GL_NEAREST, GL_LINEAR};

		m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(magValues); ++ndx)
		{
			glTexParameteri(m_textureTarget, GL_TEXTURE_MAG_FILTER, magValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MAG_FILTER, magValues[ndx]);
			expectError(GL_NO_ERROR);
		}

		//check unit conversions with float

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(magValues); ++ndx)
		{
			glTexParameterf(m_textureTarget, GL_TEXTURE_MAG_FILTER, (GLfloat)magValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MAG_FILTER, magValues[ndx]);
			expectError(GL_NO_ERROR);
		}
	}